

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexCompareVerifier.cpp
# Opt level: O0

bool tcu::isGatherCompareResultValid
               (TextureCubeView *texture,Sampler *sampler,TexComparePrecision *prec,
               CubeFaceFloatCoords *coords,float cmpReference,Vec4 *result)

{
  CubeFace face_;
  ulong uVar1;
  bool isFixedPoint;
  bool bVar2;
  CmpResultSet resultSet;
  int dim;
  int iVar3;
  int iVar4;
  deInt32 dVar5;
  deInt32 dVar6;
  ConstPixelBufferAccess *pCVar7;
  TextureFormat *format;
  float *pfVar8;
  float fVar9;
  CubeFaceIntCoords CVar10;
  byte local_1e9;
  ConstPixelBufferAccess *local_1b8;
  CmpResultSet resSet;
  ulong uStack_1a8;
  float depth;
  CubeFace local_1a0;
  CubeFaceCoords<int> local_194;
  undefined8 local_188;
  CubeFaceIntCoords c;
  int offNdx;
  bool isCurrentPixelValid;
  int local_164;
  deInt32 local_160;
  int i;
  int j;
  int face;
  ConstPixelBufferAccess faces [6];
  int maxJ;
  int minJ;
  int maxI;
  int minI;
  Vec2 vBounds;
  Vec2 uBounds;
  int size;
  bool isFixedPointDepth;
  Vec4 *result_local;
  float cmpReference_local;
  CubeFaceFloatCoords *coords_local;
  TexComparePrecision *prec_local;
  Sampler *sampler_local;
  TextureCubeView *texture_local;
  
  pCVar7 = TextureCubeView::getLevelFace(texture,0,coords->face);
  format = ConstPixelBufferAccess::getFormat(pCVar7);
  isFixedPoint = isFixedPointDepthTextureFormat(format);
  pCVar7 = TextureCubeView::getLevelFace(texture,0,coords->face);
  dim = ConstPixelBufferAccess::getWidth(pCVar7);
  bVar2 = sampler->normalizedCoords;
  fVar9 = coords->s;
  iVar3 = Vector<int,_3>::x(&prec->coordBits);
  iVar4 = Vector<int,_3>::x(&prec->uvwBits);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&vBounds,(bool)(bVar2 & 1),dim,fVar9,iVar3,iVar4);
  bVar2 = sampler->normalizedCoords;
  fVar9 = coords->t;
  iVar3 = Vector<int,_3>::y(&prec->coordBits);
  iVar4 = Vector<int,_3>::y(&prec->uvwBits);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&maxI,(bool)(bVar2 & 1),dim,fVar9,iVar3,iVar4);
  fVar9 = Vector<float,_2>::x(&vBounds);
  dVar5 = ::deFloorFloatToInt32(fVar9 - 0.5);
  fVar9 = Vector<float,_2>::y(&vBounds);
  dVar6 = ::deFloorFloatToInt32(fVar9 - 0.5);
  fVar9 = Vector<float,_2>::x((Vector<float,_2> *)&maxI);
  faces[5].m_data._4_4_ = ::deFloorFloatToInt32(fVar9 - 0.5);
  fVar9 = Vector<float,_2>::y((Vector<float,_2> *)&maxI);
  faces[5].m_data._0_4_ = ::deFloorFloatToInt32(fVar9 - 0.5);
  local_1b8 = (ConstPixelBufferAccess *)&j;
  do {
    ConstPixelBufferAccess::ConstPixelBufferAccess(local_1b8);
    local_1b8 = local_1b8 + 1;
  } while (local_1b8 != (ConstPixelBufferAccess *)&faces[5].m_data);
  for (i = 0; i < 6; i = i + 1) {
    pCVar7 = TextureCubeView::getLevelFace(texture,0,i);
    memcpy(&j + (long)i * 10,pCVar7,0x28);
  }
  local_160 = faces[5].m_data._4_4_;
  do {
    local_164 = dVar5;
    if ((deInt32)faces[5].m_data < local_160) {
      return false;
    }
    for (; local_164 <= dVar6; local_164 = local_164 + 1) {
      if ((isGatherCompareResultValid(tcu::TextureCubeView_const&,tcu::Sampler_const&,tcu::TexComparePrecision_const&,tcu::CubeFaceCoords<float>const&,float,tcu::Vector<float,int>const&)
           ::offsets == '\0') &&
         (iVar3 = __cxa_guard_acquire(&isGatherCompareResultValid(tcu::TextureCubeView_const&,tcu::Sampler_const&,tcu::TexComparePrecision_const&,tcu::CubeFaceCoords<float>const&,float,tcu::Vector<float,int>const&)
                                       ::offsets), iVar3 != 0)) {
        Vector<int,_2>::Vector(isGatherCompareResultValid::offsets,0,1);
        Vector<int,_2>::Vector(isGatherCompareResultValid::offsets + 1,1,1);
        Vector<int,_2>::Vector(isGatherCompareResultValid::offsets + 2,1,0);
        Vector<int,_2>::Vector(isGatherCompareResultValid::offsets + 3,0,0);
        __cxa_guard_release(&isGatherCompareResultValid(tcu::TextureCubeView_const&,tcu::Sampler_const&,tcu::TexComparePrecision_const&,tcu::CubeFaceCoords<float>const&,float,tcu::Vector<float,int>const&)
                             ::offsets);
      }
      c.t._3_1_ = 1;
      c.s = 0;
      while( true ) {
        local_1e9 = 0;
        if (c.s < 4) {
          local_1e9 = c.t._3_1_;
        }
        if ((local_1e9 & 1) == 0) break;
        face_ = coords->face;
        iVar3 = Vector<int,_2>::x(isGatherCompareResultValid::offsets + c.s);
        iVar4 = Vector<int,_2>::y(isGatherCompareResultValid::offsets + c.s);
        CubeFaceCoords<int>::CubeFaceCoords(&local_194,face_,local_164 + iVar3,local_160 + iVar4);
        CVar10 = remapCubeEdgeCoords(&local_194,dim);
        uStack_1a8 = CVar10._0_8_;
        local_188 = uStack_1a8;
        uVar1 = local_188;
        local_1a0 = CVar10.t;
        c.face = local_1a0;
        local_188._0_4_ = CVar10.face;
        if ((CubeFace)local_188 == CUBEFACE_LAST) {
          return true;
        }
        local_188._4_4_ = CVar10.s;
        iVar3 = local_188._4_4_;
        local_188 = uVar1;
        fVar9 = lookupDepthNoBorder((ConstPixelBufferAccess *)(&j + (uStack_1a8 & 0xffffffff) * 10),
                                    sampler,iVar3,local_1a0,0);
        resultSet = execCompare(sampler->compare,fVar9,cmpReference,prec->referenceBits,isFixedPoint
                               );
        pfVar8 = Vector<float,_4>::operator[](result,c.s);
        bVar2 = isResultInSet(resultSet,*pfVar8,prec->resultBits);
        if (!bVar2) {
          c.t._3_1_ = 0;
        }
        c.s = c.s + 1;
      }
      if ((c.t._3_1_ & 1) != 0) {
        return true;
      }
    }
    local_160 = local_160 + 1;
  } while( true );
}

Assistant:

static bool isGatherCompareResultValid (const TextureCubeView&		texture,
										const Sampler&				sampler,
										const TexComparePrecision&	prec,
										const CubeFaceFloatCoords&	coords,
										float						cmpReference,
										const Vec4&					result)
{
	const bool	isFixedPointDepth	= isFixedPointDepthTextureFormat(texture.getLevelFace(0, coords.face).getFormat());
	const int	size				= texture.getLevelFace(0, coords.face).getWidth();
	const Vec2	uBounds				= computeNonNormalizedCoordBounds(sampler.normalizedCoords, size, coords.s, prec.coordBits.x(), prec.uvwBits.x());
	const Vec2	vBounds				= computeNonNormalizedCoordBounds(sampler.normalizedCoords, size, coords.t, prec.coordBits.y(), prec.uvwBits.y());

	// Integer coordinate bounds for (x0,y0) - without wrap mode
	const int	minI				= deFloorFloatToInt32(uBounds.x()-0.5f);
	const int	maxI				= deFloorFloatToInt32(uBounds.y()-0.5f);
	const int	minJ				= deFloorFloatToInt32(vBounds.x()-0.5f);
	const int	maxJ				= deFloorFloatToInt32(vBounds.y()-0.5f);

	// Face accesses
	ConstPixelBufferAccess faces[CUBEFACE_LAST];
	for (int face = 0; face < CUBEFACE_LAST; face++)
		faces[face] = texture.getLevelFace(0, CubeFace(face));

	for (int j = minJ; j <= maxJ; j++)
	{
		for (int i = minI; i <= maxI; i++)
		{
			static const IVec2 offsets[4] =
			{
				IVec2(0, 1),
				IVec2(1, 1),
				IVec2(1, 0),
				IVec2(0, 0)
			};

			bool isCurrentPixelValid = true;

			for (int offNdx = 0; offNdx < 4 && isCurrentPixelValid; offNdx++)
			{
				const CubeFaceIntCoords c = remapCubeEdgeCoords(CubeFaceIntCoords(coords.face, i+offsets[offNdx].x(), j+offsets[offNdx].y()), size);
				// If any of samples is out of both edges, implementations can do pretty much anything according to spec.
				// \todo [2014-06-05 nuutti] Test the special case where all corner pixels have exactly the same color.
				//							 See also isSeamlessLinearCompareResultValid and similar.
				if (c.face == CUBEFACE_LAST)
					return true;

				const float			depth	= lookupDepthNoBorder(faces[c.face], sampler, c.s, c.t);
				const CmpResultSet	resSet	= execCompare(sampler.compare, depth, cmpReference, prec.referenceBits, isFixedPointDepth);

				if (!isResultInSet(resSet, result[offNdx], prec.resultBits))
					isCurrentPixelValid = false;
			}

			if (isCurrentPixelValid)
				return true;
		}
	}

	return false;
}